

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

JSValue js_os_open(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  uint uVar2;
  ulong in_RAX;
  char *__file;
  int *piVar3;
  JSValueUnion JVar4;
  int64_t iVar5;
  JSValue JVar6;
  JSValue val;
  int mode;
  int flags;
  undefined8 local_38;
  
  JVar4.float64 = 0.0;
  local_38 = in_RAX;
  __file = JS_ToCStringLen2(ctx,(size_t *)0x0,*argv,0);
  iVar5 = 6;
  if (__file == (char *)0x0) goto LAB_001138f0;
  iVar1 = JS_ToInt32(ctx,(int32_t *)((long)&local_38 + 4),argv[1]);
  if (iVar1 == 0) {
    if ((argc < 3) || ((int)argv[2].tag == 3)) {
      local_38 = CONCAT44(local_38._4_4_,0x1b6);
    }
    else {
      val.tag = argv[2].tag;
      val.u.ptr = argv[2].u.ptr;
      iVar1 = JS_ToInt32(ctx,(int32_t *)&local_38,val);
      if (iVar1 != 0) goto LAB_00113893;
    }
    uVar2 = open(__file,local_38._4_4_,local_38 & 0xffffffff);
    if (uVar2 == 0xffffffff) {
      piVar3 = __errno_location();
      uVar2 = -*piVar3;
    }
    JS_FreeCString(ctx,__file);
    JVar4._4_4_ = 0;
    JVar4.int32 = uVar2;
    iVar5 = 0;
  }
  else {
LAB_00113893:
    JS_FreeCString(ctx,__file);
    JVar4.float64 = 0.0;
  }
LAB_001138f0:
  JVar6.tag = iVar5;
  JVar6.u.float64 = JVar4.float64;
  return JVar6;
}

Assistant:

static JSValue js_os_open(JSContext *ctx, JSValueConst this_val,
                          int argc, JSValueConst *argv)
{
    const char *filename;
    int flags, mode, ret;

    filename = JS_ToCString(ctx, argv[0]);
    if (!filename)
        return JS_EXCEPTION;
    if (JS_ToInt32(ctx, &flags, argv[1]))
        goto fail;
    if (argc >= 3 && !JS_IsUndefined(argv[2])) {
        if (JS_ToInt32(ctx, &mode, argv[2])) {
        fail:
            JS_FreeCString(ctx, filename);
            return JS_EXCEPTION;
        }
    } else {
        mode = 0666;
    }
#if defined(_WIN32)
    /* force binary mode by default */
    if (!(flags & O_TEXT))
        flags |= O_BINARY;
#endif
    ret = js_get_errno(open(filename, flags, mode));
    JS_FreeCString(ctx, filename);
    return JS_NewInt32(ctx, ret);
}